

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O0

int Interpolate(int v)

{
  int y;
  int v1;
  int v0;
  int x;
  int tab_pos;
  int v_local;
  
  return kLinearToGammaTab[(v >> 9) + 1] * (v & 0x1ffU) +
         kLinearToGammaTab[v >> 9] * (0x200 - (v & 0x1ffU));
}

Assistant:

static WEBP_INLINE int Interpolate(int v) {
  const int tab_pos = v >> (GAMMA_TAB_FIX + 2);    // integer part
  const int x = v & ((kGammaTabScale << 2) - 1);  // fractional part
  const int v0 = kLinearToGammaTab[tab_pos];
  const int v1 = kLinearToGammaTab[tab_pos + 1];
  const int y = v1 * x + v0 * ((kGammaTabScale << 2) - x);   // interpolate
  assert(tab_pos + 1 < GAMMA_TAB_SIZE + 1);
  return y;
}